

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexInternalShape.h
# Opt level: O0

char * __thiscall
btConvexInternalShape::serialize
          (btConvexInternalShape *this,void *dataBuffer,btSerializer *serializer)

{
  btSerializer *in_RSI;
  void *in_RDI;
  btCollisionShape *unaff_retaddr;
  btConvexInternalShapeData *shapeData;
  
  btCollisionShape::serialize(unaff_retaddr,in_RDI,in_RSI);
  btVector3::serializeFloat
            ((btVector3 *)((long)in_RDI + 0x2c),(btVector3FloatData *)(in_RSI + 0x20));
  btVector3::serializeFloat
            ((btVector3 *)((long)in_RDI + 0x1c),(btVector3FloatData *)(in_RSI + 0x10));
  *(undefined4 *)(in_RSI + 0x30) = *(undefined4 *)((long)in_RDI + 0x3c);
  return "btConvexInternalShapeData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btConvexInternalShape::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btConvexInternalShapeData* shapeData = (btConvexInternalShapeData*) dataBuffer;
	btCollisionShape::serialize(&shapeData->m_collisionShapeData, serializer);

	m_implicitShapeDimensions.serializeFloat(shapeData->m_implicitShapeDimensions);
	m_localScaling.serializeFloat(shapeData->m_localScaling);
	shapeData->m_collisionMargin = float(m_collisionMargin);

	return "btConvexInternalShapeData";
}